

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O0

Vector3f __thiscall cosineWeightedHemisphere::sample(cosineWeightedHemisphere *this,Ray *ray,Hit *h)

{
  int iVar1;
  result_type_conflict rVar2;
  float fVar3;
  double dVar4;
  Vector3f VVar5;
  Vector3f local_c8;
  Vector3f local_bc;
  Vector3f local_b0;
  Vector3f local_a4;
  Vector3f local_98;
  float local_8c;
  float factor;
  undefined1 local_7c [8];
  Vector3f y;
  Vector3f local_64;
  undefined1 local_58 [8];
  Vector3f x;
  Vector3f normal;
  float v;
  float r;
  uniform_real_distribution<float> uniform;
  default_random_engine generator;
  Hit *h_local;
  Ray *ray_local;
  cosineWeightedHemisphere *this_local;
  
  iVar1 = rand();
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&uniform,
             (long)iVar1);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)&v,0.0,1.0);
  rVar2 = std::uniform_real_distribution<float>::operator()
                    ((uniform_real_distribution<float> *)&v,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     &uniform);
  dVar4 = sqrt((double)rVar2);
  fVar3 = (float)dVar4;
  rVar2 = std::uniform_real_distribution<float>::operator()
                    ((uniform_real_distribution<float> *)&v,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     &uniform);
  Hit::getNormal((Hit *)(x.m_elements + 1));
  Vector3f::Vector3f((Vector3f *)(y.m_elements + 1),1.0,2.0,3.0);
  Vector3f::cross(&local_64,(Vector3f *)(y.m_elements + 1),(Vector3f *)(x.m_elements + 1));
  Vector3f::normalized((Vector3f *)local_58);
  Vector3f::cross((Vector3f *)&stack0xffffffffffffff78,(Vector3f *)local_58,
                  (Vector3f *)(x.m_elements + 1));
  Vector3f::normalized((Vector3f *)local_7c);
  dVar4 = sqrt((double)(-fVar3 * fVar3 + 1.0));
  local_8c = (float)dVar4;
  ::operator*(fVar3,&local_98);
  fVar3 = local_8c;
  dVar4 = sin((double)(rVar2 * 6.2831855));
  ::operator*((float)dVar4,&local_bc);
  dVar4 = cos((double)(rVar2 * 6.2831855));
  ::operator*((float)dVar4,&local_c8);
  operator+(&local_b0,&local_bc);
  ::operator*(fVar3,&local_a4);
  VVar5 = operator+((Vector3f *)this,&local_98);
  return (Vector3f)VVar5.m_elements;
}

Assistant:

Vector3f cosineWeightedHemisphere::sample(const Ray &ray, Hit &h) const {
    std::default_random_engine generator(rand());
    std::uniform_real_distribution<float> uniform(0.f, 1.f);

    float r = sqrt(uniform(generator));
    float v = 2.f * (float)M_PI * uniform(generator);
    Vector3f normal = h.getNormal();

    // TODO: think of a better way to do this
    Vector3f x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
    Vector3f y = Vector3f::cross(x, normal).normalized();

    float factor = sqrt(1-r*r);

    return r * normal + factor * (sin(v) * x + cos(v) * y);
}